

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

ER __thiscall slang::ast::ForLoopStatement::evalImpl(ForLoopStatement *this,EvalContext *context)

{
  size_type sVar1;
  pointer ppEVar2;
  __index_type _Var3;
  ER EVar4;
  int iVar5;
  char cVar6;
  ER EVar7;
  long lVar8;
  bool bVar9;
  ConstantValue result;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  sVar1 = (this->initializers).size_;
  bVar9 = sVar1 == 0;
  if (!bVar9) {
    ppEVar2 = (this->initializers).data_;
    Expression::eval((ConstantValue *)&local_58,*ppEVar2,context);
    _Var3 = local_58._M_index;
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_58);
    if (_Var3 != '\0') {
      lVar8 = 8;
      do {
        bVar9 = sVar1 << 3 == lVar8;
        if (bVar9) goto LAB_0027effb;
        Expression::eval((ConstantValue *)&local_58,*(Expression **)((long)ppEVar2 + lVar8),context)
        ;
        _Var3 = local_58._M_index;
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_58);
        lVar8 = lVar8 + 8;
      } while (_Var3 != '\0');
    }
    if (!bVar9) {
      return Fail;
    }
  }
LAB_0027effb:
  EVar7 = Fail;
  do {
    if (this->stopExpr != (Expression *)0x0) {
      Expression::eval((ConstantValue *)&local_58,this->stopExpr,context);
      if (local_58._M_index == '\0') {
        EVar7 = Fail;
        cVar6 = '\x01';
      }
      else {
        bVar9 = ConstantValue::isTrue((ConstantValue *)&local_58);
        cVar6 = !bVar9 * '\x05';
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
      if (cVar6 != '\0') {
        if (cVar6 != '\x01') {
          return Success;
        }
        goto LAB_0027f0eb;
      }
    }
    EVar4 = Statement::eval(this->body,context);
    if (EVar4 == Success) {
LAB_0027f06c:
      sVar1 = (this->steps).size_;
      iVar5 = 0;
      if (sVar1 != 0) {
        ppEVar2 = (this->steps).data_;
        lVar8 = 0;
        do {
          Expression::eval((ConstantValue *)&local_58,*(Expression **)((long)ppEVar2 + lVar8),
                           context);
          _Var3 = local_58._M_index;
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage(&local_58);
          if (_Var3 == '\0') {
            iVar5 = 1;
            EVar7 = Fail;
            goto LAB_0027f0d9;
          }
          lVar8 = lVar8 + 8;
        } while (sVar1 << 3 != lVar8);
        iVar5 = 0;
      }
    }
    else if (EVar4 == Break) {
      iVar5 = 5;
    }
    else {
      if (EVar4 == Continue) goto LAB_0027f06c;
      iVar5 = 1;
      EVar7 = EVar4;
    }
LAB_0027f0d9:
  } while (iVar5 == 0);
  EVar4 = Success;
  if (iVar5 != 5) {
LAB_0027f0eb:
    EVar4 = EVar7;
  }
  return EVar4;
}

Assistant:

ER ForLoopStatement::evalImpl(EvalContext& context) const {
    for (auto init : initializers) {
        if (!init->eval(context))
            return ER::Fail;
    }

    while (true) {
        if (stopExpr) {
            auto result = stopExpr->eval(context);
            if (result.bad())
                return ER::Fail;

            if (!result.isTrue())
                break;
        }

        ER result = body.eval(context);
        if (result != ER::Success) {
            if (result == ER::Break)
                break;
            else if (result != ER::Continue)
                return result;
        }

        for (auto step : steps) {
            if (!step->eval(context))
                return ER::Fail;
        }
    }

    return ER::Success;
}